

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_4_3_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  float *data;
  int c2;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  ulong uVar40;
  int c1;
  int scale;
  long lVar41;
  int iVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  uint uVar47;
  float *pfVar48;
  int k_count;
  float *pfVar49;
  long lVar50;
  long lVar51;
  int iVar52;
  ulong uVar53;
  float *pfVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  float *pfVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [12];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  float fVar102;
  undefined1 auVar103 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [64];
  int data_width;
  int local_120;
  
  auVar73._8_4_ = 0x3effffff;
  auVar73._0_8_ = 0x3effffff3effffff;
  auVar73._12_4_ = 0x3effffff;
  auVar103 = ZEXT1664(auVar73);
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar100 = ZEXT1664(auVar72);
  fVar80 = ipoint->scale;
  auVar107 = ZEXT464((uint)fVar80);
  auVar65 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)fVar80),auVar72,0xf8);
  auVar65 = ZEXT416((uint)(fVar80 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  fVar78 = -0.08 / (fVar80 * fVar80);
  scale = (int)auVar65._0_4_;
  auVar66._0_4_ = (int)auVar65._0_4_;
  auVar66._4_4_ = (int)auVar65._4_4_;
  auVar66._8_4_ = (int)auVar65._8_4_;
  auVar66._12_4_ = (int)auVar65._12_4_;
  auVar65 = vcvtdq2ps_avx(auVar66);
  auVar66 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)ipoint->x),auVar72,0xf8);
  auVar66 = ZEXT416((uint)(ipoint->x + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67._0_8_ = (double)auVar66._0_4_;
  auVar67._8_8_ = auVar66._8_8_;
  auVar71._0_8_ = (double)fVar80;
  auVar71._8_8_ = 0;
  auVar66 = vfmadd231sd_fma(auVar67,auVar71,ZEXT816(0x3fe0000000000000));
  auVar70._0_4_ = (float)auVar66._0_8_;
  auVar70._4_12_ = auVar66._4_12_;
  auVar66 = vpternlogd_avx512vl(auVar73,ZEXT416((uint)ipoint->y),auVar72,0xf8);
  fVar8 = auVar70._0_4_ - auVar65._0_4_;
  auVar66 = ZEXT416((uint)(ipoint->y + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar68._0_8_ = (double)auVar66._0_4_;
  auVar68._8_8_ = auVar66._8_8_;
  auVar66 = vfmadd231sd_fma(auVar68,auVar71,ZEXT816(0x3fe0000000000000));
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar80),auVar70);
  auVar69._0_4_ = (float)auVar66._0_8_;
  auVar69._4_12_ = auVar66._4_12_;
  fVar106 = auVar69._0_4_ - auVar65._0_4_;
  auVar65 = vpternlogd_avx512vl(auVar73,auVar67,auVar72,0xf8);
  auVar65 = ZEXT416((uint)(auVar67._0_4_ + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = ZEXT416((uint)fVar80);
  if (scale < (int)auVar65._0_4_) {
    auVar74._8_4_ = 0x3effffff;
    auVar74._0_8_ = 0x3effffff3effffff;
    auVar74._12_4_ = 0x3effffff;
    auVar75._8_4_ = 0x80000000;
    auVar75._0_8_ = 0x8000000080000000;
    auVar75._12_4_ = 0x80000000;
    auVar65 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar66,auVar69);
    auVar67 = vpternlogd_avx512vl(auVar75,auVar65,auVar74,0xea);
    auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar67._0_4_));
    auVar65 = vroundss_avx(auVar65,auVar65,0xb);
    if (scale < (int)auVar65._0_4_) {
      auVar65 = vfmadd231ss_fma(auVar70,auVar66,ZEXT416(0x41300000));
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar67 = vpternlogd_avx512vl(auVar76,auVar65,auVar74,0xea);
      auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar67._0_4_));
      auVar65 = vroundss_avx(auVar65,auVar65,0xb);
      if ((int)auVar65._0_4_ + scale <= iimage->width) {
        auVar65 = vfmadd231ss_fma(auVar69,auVar66,ZEXT416(0x41300000));
        auVar17._8_4_ = 0x80000000;
        auVar17._0_8_ = 0x8000000080000000;
        auVar17._12_4_ = 0x80000000;
        auVar67 = vpternlogd_avx512vl(auVar74,auVar65,auVar17,0xf8);
        auVar65 = ZEXT416((uint)(auVar65._0_4_ + auVar67._0_4_));
        auVar65 = vroundss_avx(auVar65,auVar65,0xb);
        if ((int)auVar65._0_4_ + scale <= iimage->height) {
          pfVar48 = iimage->data;
          iVar1 = iimage->data_width;
          iVar42 = scale * 2;
          fVar8 = fVar8 + 0.5;
          fVar106 = fVar106 + 0.5;
          pfVar54 = haarResponseY + 0x4a;
          pfVar63 = haarResponseX + 0x4a;
          uVar37 = 0xfffffff4;
          do {
            auVar65._0_4_ = (float)(int)uVar37;
            auVar101 = in_ZMM8._4_12_;
            auVar65._4_12_ = auVar101;
            auVar94._0_4_ = (float)(int)(uVar37 | 1);
            auVar94._4_12_ = auVar101;
            auVar98._0_4_ = (float)(int)(uVar37 | 2);
            auVar98._4_12_ = auVar101;
            auVar65 = vfmadd213ss_fma(auVar65,auVar66,ZEXT416((uint)fVar106));
            auVar67 = vfmadd213ss_fma(auVar94,auVar66,ZEXT416((uint)fVar106));
            auVar68 = vfmadd213ss_fma(auVar98,auVar66,ZEXT416((uint)fVar106));
            iVar24 = (int)auVar65._0_4_;
            iVar27 = (int)auVar67._0_4_;
            auVar95._0_4_ = (float)(int)(uVar37 | 3);
            auVar95._4_12_ = auVar101;
            iVar25 = (int)auVar68._0_4_;
            auVar65 = vfmadd213ss_fma(auVar95,auVar66,ZEXT416((uint)fVar106));
            iVar30 = (iVar24 + -1) * iVar1;
            iVar23 = (iVar24 + -1 + scale) * iVar1;
            iVar34 = (iVar24 + -1 + iVar42) * iVar1;
            iVar26 = (int)auVar65._0_4_;
            iVar31 = (iVar27 + -1 + iVar42) * iVar1;
            iVar33 = (iVar27 + -1) * iVar1;
            iVar24 = (iVar27 + -1 + scale) * iVar1;
            iVar28 = (iVar25 + -1) * iVar1;
            iVar32 = (iVar25 + -1 + iVar42) * iVar1;
            iVar25 = (iVar25 + -1 + scale) * iVar1;
            lVar61 = 0;
            iVar27 = (iVar26 + -1) * iVar1;
            iVar29 = (iVar26 + -1 + iVar42) * iVar1;
            iVar26 = (iVar26 + -1 + scale) * iVar1;
            do {
              iVar35 = (int)lVar61;
              auVar88._0_4_ = (float)(iVar35 + -0xc);
              auVar101 = auVar103._4_12_;
              auVar88._4_12_ = auVar101;
              auVar65 = vfmadd213ss_fma(auVar88,auVar66,ZEXT416((uint)fVar8));
              iVar57 = (int)auVar65._0_4_;
              auVar89._0_4_ = (float)(iVar35 + -0xb);
              auVar89._4_12_ = auVar101;
              auVar65 = vfmadd213ss_fma(auVar89,auVar66,ZEXT416((uint)fVar8));
              iVar44 = (int)auVar65._0_4_;
              auVar90._0_4_ = (float)(iVar35 + -10);
              auVar90._4_12_ = auVar101;
              auVar65 = vfmadd213ss_fma(auVar90,auVar66,ZEXT416((uint)fVar8));
              iVar39 = iVar57 + -1 + scale;
              iVar36 = iVar57 + -1 + iVar42;
              fVar80 = pfVar48[iVar34 + -1 + iVar57];
              fVar79 = pfVar48[iVar30 + iVar36];
              auVar69 = SUB6416(ZEXT464(0x40000000),0);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar39] -
                                                      pfVar48[iVar34 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar36] -
                                                      pfVar48[iVar30 + -1 + iVar57])));
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar23 + -1 + iVar57] -
                                                      pfVar48[iVar23 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar36] -
                                                      pfVar48[iVar30 + -1 + iVar57])));
              pfVar63[lVar61 + -0x4a] = (fVar80 - fVar79) + auVar67._0_4_;
              pfVar54[lVar61 + -0x4a] = auVar68._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar31 + -1 + iVar57];
              fVar79 = pfVar48[iVar33 + iVar36];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar33 + iVar39] -
                                                      pfVar48[iVar31 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar31 + iVar36] -
                                                      pfVar48[iVar33 + -1 + iVar57])));
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar24 + -1 + iVar57] -
                                                      pfVar48[iVar24 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar31 + iVar36] -
                                                      pfVar48[iVar33 + -1 + iVar57])));
              pfVar63[lVar61 + -0x32] = (fVar80 - fVar79) + auVar67._0_4_;
              pfVar54[lVar61 + -0x32] = auVar68._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar32 + -1 + iVar57];
              fVar79 = pfVar48[iVar28 + iVar36];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar28 + iVar39] -
                                                      pfVar48[iVar32 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar32 + iVar36] -
                                                      pfVar48[iVar28 + -1 + iVar57])));
              auVar68 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar25 + -1 + iVar57] -
                                                      pfVar48[iVar25 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar32 + iVar36] -
                                                      pfVar48[iVar28 + -1 + iVar57])));
              pfVar63[lVar61 + -0x1a] = (fVar80 - fVar79) + auVar67._0_4_;
              pfVar54[lVar61 + -0x1a] = auVar68._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar29 + -1 + iVar57];
              iVar58 = (int)auVar65._0_4_;
              fVar79 = pfVar48[iVar27 + iVar36];
              auVar103 = ZEXT464((uint)pfVar48[iVar36 + iVar29]);
              auVar67 = ZEXT416((uint)(pfVar48[iVar36 + iVar29] - pfVar48[iVar27 + -1 + iVar57]));
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar27 + iVar39] -
                                                      pfVar48[iVar39 + iVar29])),auVar69,auVar67);
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar26 + -1 + iVar57] -
                                                      pfVar48[iVar26 + iVar36])),auVar69,auVar67);
              pfVar63[lVar61 + -2] = (fVar80 - fVar79) + auVar65._0_4_;
              pfVar54[lVar61 + -2] = auVar67._0_4_ - (fVar80 - fVar79);
              iVar36 = iVar44 + -1 + iVar42;
              iVar57 = iVar44 + -1 + scale;
              fVar80 = pfVar48[iVar34 + -1 + iVar44];
              fVar79 = pfVar48[iVar30 + iVar36];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar57] -
                                                      pfVar48[iVar34 + iVar57])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar36] -
                                                      pfVar48[iVar30 + -1 + iVar44])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar23 + -1 + iVar44] -
                                                      pfVar48[iVar23 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar36] -
                                                      pfVar48[iVar30 + -1 + iVar44])));
              pfVar63[lVar61 + -0x49] = (fVar80 - fVar79) + auVar65._0_4_;
              pfVar54[lVar61 + -0x49] = auVar67._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar31 + -1 + iVar44];
              fVar79 = pfVar48[iVar33 + iVar36];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar33 + iVar57] -
                                                      pfVar48[iVar31 + iVar57])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar31 + iVar36] -
                                                      pfVar48[iVar33 + -1 + iVar44])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar24 + -1 + iVar44] -
                                                      pfVar48[iVar24 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar31 + iVar36] -
                                                      pfVar48[iVar33 + -1 + iVar44])));
              pfVar63[lVar61 + -0x31] = (fVar80 - fVar79) + auVar65._0_4_;
              pfVar54[lVar61 + -0x31] = auVar67._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar32 + -1 + iVar44];
              fVar79 = pfVar48[iVar28 + iVar36];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar28 + iVar57] -
                                                      pfVar48[iVar32 + iVar57])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar32 + iVar36] -
                                                      pfVar48[iVar28 + -1 + iVar44])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar25 + -1 + iVar44] -
                                                      pfVar48[iVar25 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar32 + iVar36] -
                                                      pfVar48[iVar28 + -1 + iVar44])));
              pfVar63[lVar61 + -0x19] = (fVar80 - fVar79) + auVar65._0_4_;
              pfVar54[lVar61 + -0x19] = auVar67._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar29 + -1 + iVar44];
              fVar79 = pfVar48[iVar27 + iVar36];
              iVar39 = iVar58 + -1 + iVar42;
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar27 + iVar57] -
                                                      pfVar48[iVar57 + iVar29])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar36 + iVar29] -
                                                      pfVar48[iVar27 + -1 + iVar44])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar26 + -1 + iVar44] -
                                                      pfVar48[iVar26 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar36 + iVar29] -
                                                      pfVar48[iVar27 + -1 + iVar44])));
              pfVar63[lVar61 + -1] = (fVar80 - fVar79) + auVar65._0_4_;
              pfVar54[lVar61 + -1] = auVar67._0_4_ - (fVar80 - fVar79);
              iVar36 = iVar58 + -1 + scale;
              fVar80 = pfVar48[iVar34 + -1 + iVar58];
              fVar79 = pfVar48[iVar30 + iVar39];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar23 + -1 + iVar58] -
                                                      pfVar48[iVar23 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar39] -
                                                      pfVar48[iVar30 + -1 + iVar58])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar30 + iVar36] -
                                                      pfVar48[iVar34 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar34 + iVar39] -
                                                      pfVar48[iVar30 + -1 + iVar58])));
              pfVar63[lVar61 + -0x48] = (fVar80 - fVar79) + auVar67._0_4_;
              pfVar54[lVar61 + -0x48] = auVar65._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar31 + -1 + iVar58];
              fVar79 = pfVar48[iVar33 + iVar39];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar24 + -1 + iVar58] -
                                                      pfVar48[iVar24 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar31 + iVar39] -
                                                      pfVar48[iVar33 + -1 + iVar58])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar33 + iVar36] -
                                                      pfVar48[iVar31 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar31 + iVar39] -
                                                      pfVar48[iVar33 + -1 + iVar58])));
              pfVar63[lVar61 + -0x30] = (fVar80 - fVar79) + auVar67._0_4_;
              pfVar54[lVar61 + -0x30] = auVar65._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar32 + -1 + iVar58];
              fVar79 = pfVar48[iVar28 + iVar39];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar25 + -1 + iVar58] -
                                                      pfVar48[iVar25 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar32 + iVar39] -
                                                      pfVar48[iVar28 + -1 + iVar58])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar28 + iVar36] -
                                                      pfVar48[iVar32 + iVar36])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar32 + iVar39] -
                                                      pfVar48[iVar28 + -1 + iVar58])));
              pfVar63[lVar61 + -0x18] = (fVar80 - fVar79) + auVar67._0_4_;
              pfVar54[lVar61 + -0x18] = auVar65._0_4_ - (fVar80 - fVar79);
              fVar80 = pfVar48[iVar29 + -1 + iVar58];
              fVar79 = pfVar48[iVar27 + iVar39];
              auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar27 + iVar36] -
                                                      pfVar48[iVar36 + iVar29])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar39 + iVar29] -
                                                      pfVar48[iVar27 + -1 + iVar58])));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar48[iVar26 + -1 + iVar58] -
                                                      pfVar48[iVar26 + iVar39])),auVar69,
                                        ZEXT416((uint)(pfVar48[iVar39 + iVar29] -
                                                      pfVar48[iVar27 + -1 + iVar58])));
              pfVar63[lVar61] = (fVar80 - fVar79) + auVar65._0_4_;
              pfVar54[lVar61] = auVar67._0_4_ - (fVar80 - fVar79);
              lVar61 = lVar61 + 3;
            } while (iVar35 + -0xc < 9);
            pfVar54 = pfVar54 + 0x60;
            pfVar63 = pfVar63 + 0x60;
            bVar3 = (int)uVar37 < 8;
            uVar37 = uVar37 + 4;
          } while (bVar3);
          goto LAB_002164ea;
        }
      }
    }
  }
  iVar1 = scale * 2;
  lVar61 = 0;
  uVar37 = 0xfffffff4;
  do {
    auVar65 = vpbroadcastd_avx512vl();
    auVar18._8_4_ = 3;
    auVar18._0_8_ = 0x200000003;
    auVar18._12_4_ = 2;
    auVar65 = vporq_avx512vl(auVar65,auVar18);
    auVar21._4_4_ = fVar106;
    auVar21._0_4_ = fVar106;
    auVar21._8_4_ = fVar106;
    auVar21._12_4_ = fVar106;
    auVar65 = vpinsrd_avx(auVar65,uVar37 | 1,2);
    auVar65 = vpinsrd_avx(auVar65,uVar37,3);
    auVar65 = vcvtdq2ps_avx(auVar65);
    auVar22._4_4_ = fVar80;
    auVar22._0_4_ = fVar80;
    auVar22._8_4_ = fVar80;
    auVar22._12_4_ = fVar80;
    auVar65 = vfmadd132ps_fma(auVar65,auVar21,auVar22);
    uVar38 = vcmpps_avx512vl(auVar65,_DAT_00599190,0xd);
    auVar7 = vcvtps2pd_avx(auVar65);
    auVar83._8_8_ = 0xbfe0000000000000;
    auVar83._0_8_ = 0xbfe0000000000000;
    auVar83._16_8_ = 0xbfe0000000000000;
    auVar83._24_8_ = 0xbfe0000000000000;
    auVar77._12_4_ = 0x3fe00000;
    auVar77._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar77._16_8_ = 0x3fe0000000000000;
    auVar77._24_8_ = 0x3fe0000000000000;
    auVar77 = vblendmpd_avx512vl(auVar83,auVar77);
    bVar3 = (bool)((byte)uVar38 & 1);
    bVar4 = (bool)((byte)(uVar38 >> 1) & 1);
    bVar5 = (bool)((byte)(uVar38 >> 2) & 1);
    bVar6 = (bool)((byte)(uVar38 >> 3) & 1);
    auVar81._0_4_ =
         (int)((double)((ulong)bVar3 * auVar77._0_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar7._0_8_);
    auVar81._4_4_ =
         (int)((double)((ulong)bVar4 * auVar77._8_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar7._8_8_);
    auVar81._8_4_ =
         (int)((double)((ulong)bVar5 * auVar77._16_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar7._16_8_);
    auVar81._12_4_ =
         (int)((double)((ulong)bVar6 * auVar77._24_8_ | (ulong)!bVar6 * -0x4020000000000000) +
              auVar7._24_8_);
    auVar19._8_4_ = 1;
    auVar19._0_8_ = 0x100000001;
    auVar19._12_4_ = 1;
    uVar38 = vpcmpd_avx512vl(auVar81,auVar19,1);
    uVar64 = uVar38 & 0xf;
    iVar27 = iVar1 + auVar81._12_4_;
    iVar28 = auVar81._12_4_ + -1 + scale;
    iVar29 = iVar1 + -1 + auVar81._12_4_;
    iVar23 = auVar81._12_4_ + -1;
    uVar53 = uVar64 >> 1;
    iVar30 = iVar1 + auVar81._8_4_;
    iVar31 = auVar81._8_4_ + -1 + scale;
    iVar32 = auVar81._8_4_ + -1;
    iVar24 = iVar1 + -1 + auVar81._8_4_;
    iVar33 = iVar1 + auVar81._4_4_;
    iVar34 = auVar81._4_4_ + -1;
    uVar40 = uVar64 >> 2;
    uVar64 = uVar64 >> 3;
    iVar35 = auVar81._4_4_ + -1 + scale;
    iVar25 = iVar1 + -1 + auVar81._4_4_;
    iVar44 = auVar81._0_4_ + -1 + scale;
    iVar36 = iVar1 + auVar81._0_4_;
    iVar39 = iVar1 + -1 + auVar81._0_4_;
    iVar26 = auVar81._0_4_ + -1;
    pfVar48 = haarResponseX;
    pfVar63 = haarResponseY;
    lVar60 = lVar61;
    iVar42 = -0xc;
    do {
      auVar82._0_4_ = (float)iVar42;
      auVar101 = auVar100._4_12_;
      auVar82._4_12_ = auVar101;
      auVar67 = auVar107._0_16_;
      auVar65 = vfmadd213ss_fma(auVar82,auVar67,ZEXT416((uint)fVar8));
      auVar97._0_4_ = (float)(iVar42 + 1);
      auVar97._4_12_ = auVar101;
      auVar92._0_4_ = (float)(iVar42 + 2);
      auVar92._4_12_ = auVar101;
      fVar79 = auVar65._0_4_;
      auVar99._0_8_ = (double)fVar79;
      auVar99._8_8_ = auVar65._8_8_;
      auVar100 = ZEXT1664(auVar99);
      auVar65 = vfmadd213ss_fma(auVar97,auVar67,ZEXT416((uint)fVar8));
      auVar67 = vfmadd213ss_fma(auVar92,auVar67,ZEXT416((uint)fVar8));
      fVar96 = auVar65._0_4_;
      fVar91 = auVar67._0_4_;
      iVar58 = (int)((double)((ulong)(0.0 <= fVar79) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar79) * -0x4020000000000000) + auVar99._0_8_);
      if ((iVar58 < 1 || uVar64 != 0) || (iimage->height < iVar27)) {
LAB_002155f1:
        auVar100 = ZEXT1664(auVar99);
        haarXY(iimage,auVar81._12_4_,iVar58,scale,(float *)((long)pfVar48 + lVar60),
               (float *)((long)pfVar63 + lVar60));
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar57 = iimage->width;
        iVar45 = iVar1 + iVar58;
        if (iVar57 < iVar45) goto LAB_002155f1;
        iVar46 = iimage->data_width;
        iVar55 = iVar58 + -1 + scale;
        pfVar54 = iimage->data;
        iVar52 = iVar46 * iVar23;
        iVar56 = iVar46 * iVar29;
        fVar79 = pfVar54[iVar56 + -1 + iVar58];
        fVar9 = pfVar54[iVar52 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar52 + iVar55] - pfVar54[iVar56 + iVar55]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar54[iVar56 + -1 + iVar45] -
                                                pfVar54[iVar52 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar46 * iVar28 + -1 + iVar58] -
                                                pfVar54[iVar46 * iVar28 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar54[iVar56 + -1 + iVar45] -
                                                pfVar54[iVar52 + -1 + iVar58])));
        *(float *)((long)pfVar48 + lVar60) = (fVar79 - fVar9) + auVar65._0_4_;
        *(float *)((long)pfVar63 + lVar60) = auVar67._0_4_ - (fVar79 - fVar9);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0x60);
      pfVar49 = (float *)((long)pfVar63 + lVar60 + 0x60);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._8_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar32;
        iVar52 = iVar46 * iVar24;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar9 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar31 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar31 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar9) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar9);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0xc0);
      pfVar49 = (float *)(lVar60 + 0xc0 + (long)pfVar63);
      if (((iVar58 < 1 || (uVar53 & 1) != 0) || (iimage->height < iVar33)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._4_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar34;
        iVar52 = iVar46 * iVar25;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar9 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar35 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar35 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar9) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar9);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0x120);
      pfVar49 = (float *)(lVar60 + 0x120 + (long)pfVar63);
      if (((iVar58 < 1 || (uVar38 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._0_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar46 = iimage->data_width;
        iVar56 = iVar58 + -1 + scale;
        pfVar2 = iimage->data;
        iVar52 = iVar46 * iVar26;
        iVar55 = iVar46 * iVar39;
        fVar79 = pfVar2[iVar55 + -1 + iVar58];
        fVar9 = pfVar2[iVar52 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar52 + iVar56] - pfVar2[iVar55 + iVar56]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar55 + -1 + iVar45] -
                                                pfVar2[iVar52 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar44 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar44 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar55 + -1 + iVar45] -
                                                pfVar2[iVar52 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar9) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar9);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 4);
      pfVar49 = (float *)((long)pfVar63 + lVar60 + 4);
      iVar58 = (int)((double)((ulong)(0.0 <= fVar96) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar96) * -0x4020000000000000) + (double)fVar96);
      if (((iVar58 < 1 || uVar64 != 0) || (iimage->height < iVar27)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._12_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar23;
        iVar52 = iVar46 * iVar29;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar96 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar28 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar28 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar96) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar96);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 100);
      pfVar49 = (float *)((long)pfVar63 + lVar60 + 100);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._8_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar32;
        iVar52 = iVar46 * iVar24;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar96 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar31 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar31 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar96) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar96);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0xc4);
      pfVar49 = (float *)(lVar60 + 0xc4 + (long)pfVar63);
      if (((iVar58 < 1 || (uVar53 & 1) != 0) || (iimage->height < iVar33)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._4_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar34;
        iVar52 = iVar46 * iVar25;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar96 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar35 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar35 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar96) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar96);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0x124);
      pfVar49 = (float *)(lVar60 + 0x124 + (long)pfVar63);
      if (((iVar58 < 1 || (uVar38 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._0_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar46 = iimage->data_width;
        iVar56 = iVar58 + -1 + scale;
        pfVar2 = iimage->data;
        iVar52 = iVar46 * iVar26;
        iVar55 = iVar46 * iVar39;
        fVar79 = pfVar2[iVar55 + -1 + iVar58];
        fVar96 = pfVar2[iVar52 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar52 + iVar56] - pfVar2[iVar55 + iVar56]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar55 + -1 + iVar45] -
                                                pfVar2[iVar52 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar44 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar44 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar55 + -1 + iVar45] -
                                                pfVar2[iVar52 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar96) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar96);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 8);
      pfVar49 = (float *)((long)pfVar63 + lVar60 + 8);
      iVar58 = (int)((double)((ulong)(0.0 <= fVar91) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar91) * -0x4020000000000000) + (double)fVar91);
      if (((iVar58 < 1 || uVar64 != 0) || (iimage->height < iVar27)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._12_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar23;
        iVar52 = iVar46 * iVar29;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar91 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar28 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar28 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar91) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar91);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0x68);
      pfVar49 = (float *)((long)pfVar63 + lVar60 + 0x68);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar30)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._8_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar32;
        iVar52 = iVar46 * iVar24;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar91 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar31 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar31 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar91) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar91);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 200);
      pfVar49 = (float *)(lVar60 + 200 + (long)pfVar63);
      if (((iVar58 < 1 || (uVar53 & 1) != 0) || (iimage->height < iVar33)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._4_4_,iVar58,scale,pfVar54,pfVar49);
        iVar57 = iimage->width;
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar55 = iVar58 + -1 + scale;
        iVar46 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar56 = iVar46 * iVar34;
        iVar52 = iVar46 * iVar25;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar91 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar55] - pfVar2[iVar52 + iVar55]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 * iVar35 + -1 + iVar58] -
                                                pfVar2[iVar46 * iVar35 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar91) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar91);
      }
      pfVar54 = (float *)((long)pfVar48 + lVar60 + 0x128);
      pfVar49 = (float *)(lVar60 + 0x128 + (long)pfVar63);
      if (((iVar58 < 1 || (uVar38 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar45 = iVar1 + iVar58, iVar57 < iVar45)) {
        auVar100 = ZEXT1664(auVar100._0_16_);
        haarXY(iimage,auVar81._0_4_,iVar58,scale,pfVar54,pfVar49);
        pfVar48 = haarResponseX;
        pfVar63 = haarResponseY;
      }
      else {
        iVar57 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar46 = iVar58 + -1 + scale;
        iVar56 = iVar57 * iVar26;
        iVar52 = iVar57 * iVar39;
        fVar79 = pfVar2[iVar52 + -1 + iVar58];
        fVar91 = pfVar2[iVar56 + -1 + iVar45];
        auVar65 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar56 + iVar46] - pfVar2[iVar52 + iVar46]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar57 * iVar44 + -1 + iVar58] -
                                                pfVar2[iVar57 * iVar44 + -1 + iVar45])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar52 + -1 + iVar45] -
                                                pfVar2[iVar56 + -1 + iVar58])));
        *pfVar54 = (fVar79 - fVar91) + auVar65._0_4_;
        *pfVar49 = auVar67._0_4_ - (fVar79 - fVar91);
      }
      auVar107 = ZEXT1664(auVar66);
      lVar60 = lVar60 + 0xc;
      bVar3 = iVar42 < 9;
      iVar42 = iVar42 + 3;
    } while (bVar3);
    lVar61 = lVar61 + 0x180;
    bVar3 = (int)uVar37 < 8;
    uVar37 = uVar37 + 4;
  } while (bVar3);
LAB_002164ea:
  fVar106 = auVar107._0_4_;
  auVar105._8_4_ = 0x3effffff;
  auVar105._0_8_ = 0x3effffff3effffff;
  auVar105._12_4_ = 0x3effffff;
  auVar104._8_4_ = 0x80000000;
  auVar104._0_8_ = 0x8000000080000000;
  auVar104._12_4_ = 0x80000000;
  auVar65 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 0.5)),auVar104,0xf8);
  auVar65 = ZEXT416((uint)(fVar106 * 0.5 + auVar65._0_4_));
  auVar65 = vroundss_avx(auVar65,auVar65,0xb);
  auVar66 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 1.5)),auVar104,0xf8);
  auVar66 = ZEXT416((uint)(fVar106 * 1.5 + auVar66._0_4_));
  auVar66 = vroundss_avx(auVar66,auVar66,0xb);
  auVar67 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 2.5)),auVar104,0xf8);
  auVar67 = ZEXT416((uint)(fVar106 * 2.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 3.5)),auVar104,0xf8);
  auVar68 = ZEXT416((uint)(fVar106 * 3.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 4.5)),auVar104,0xf8);
  auVar69 = ZEXT416((uint)(fVar106 * 4.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 5.5)),auVar104,0xf8);
  auVar70 = ZEXT416((uint)(fVar106 * 5.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 6.5)),auVar104,0xf8);
  auVar71 = ZEXT416((uint)(fVar106 * 6.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 7.5)),auVar104,0xf8);
  auVar72 = ZEXT416((uint)(auVar72._0_4_ + fVar106 * 7.5));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 8.5)),auVar104,0xf8);
  auVar73 = ZEXT416((uint)(fVar106 * 8.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 9.5)),auVar104,0xf8);
  auVar74 = ZEXT416((uint)(fVar106 * 9.5 + auVar74._0_4_));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 10.5)),auVar104,0xf8);
  auVar75 = ZEXT416((uint)(fVar106 * 10.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar105,ZEXT416((uint)(fVar106 * 11.5)),auVar104,0xf8);
  fVar85 = auVar67._0_4_;
  fVar80 = fVar85 + auVar66._0_4_;
  fVar8 = fVar85 + auVar65._0_4_;
  auVar67 = ZEXT416((uint)(fVar106 * 11.5 + auVar76._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  fVar106 = fVar85 - auVar65._0_4_;
  fVar79 = fVar85 - auVar66._0_4_;
  fVar91 = fVar85 - auVar68._0_4_;
  fVar96 = fVar85 - auVar69._0_4_;
  fVar9 = fVar85 - auVar70._0_4_;
  fVar85 = fVar85 - auVar71._0_4_;
  fVar102 = auVar72._0_4_;
  fVar10 = fVar102 - auVar68._0_4_;
  fVar11 = fVar102 - auVar69._0_4_;
  fVar12 = fVar102 - auVar70._0_4_;
  fVar13 = fVar102 - auVar71._0_4_;
  fVar14 = fVar102 - auVar73._0_4_;
  fVar15 = fVar102 - auVar74._0_4_;
  fVar16 = fVar102 - auVar75._0_4_;
  fVar102 = fVar102 - auVar67._0_4_;
  gauss_s1_c0[0] = expf(fVar80 * fVar80 * fVar78);
  gauss_s1_c0[1] = expf(fVar8 * fVar8 * fVar78);
  gauss_s1_c0[2] = expf(fVar106 * fVar106 * fVar78);
  gauss_s1_c0[3] = expf(fVar79 * fVar79 * fVar78);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar91 * fVar91 * fVar78);
  gauss_s1_c0[6] = expf(fVar96 * fVar96 * fVar78);
  gauss_s1_c0[7] = expf(fVar9 * fVar9 * fVar78);
  gauss_s1_c0[8] = expf(fVar85 * fVar85 * fVar78);
  gauss_s1_c1[0] = expf(fVar10 * fVar10 * fVar78);
  gauss_s1_c1[1] = expf(fVar11 * fVar11 * fVar78);
  gauss_s1_c1[2] = expf(fVar12 * fVar12 * fVar78);
  gauss_s1_c1[3] = expf(fVar13 * fVar13 * fVar78);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar14 * fVar14 * fVar78);
  gauss_s1_c1[6] = expf(fVar15 * fVar15 * fVar78);
  gauss_s1_c1[7] = expf(fVar16 * fVar16 * fVar78);
  gauss_s1_c1[8] = expf(fVar102 * fVar102 * fVar78);
  auVar84._8_4_ = 0x7fffffff;
  auVar84._0_8_ = 0x7fffffff7fffffff;
  auVar84._12_4_ = 0x7fffffff;
  uVar38 = 0xfffffff8;
  fVar80 = 0.0;
  lVar61 = 0;
  lVar60 = 0;
  local_120 = 0;
  do {
    pfVar48 = gauss_s1_c1;
    uVar37 = (uint)uVar38;
    if (uVar37 != 7) {
      pfVar48 = gauss_s1_c0;
    }
    lVar59 = (long)local_120;
    lVar60 = (long)(int)lVar60;
    if (uVar37 == 0xfffffff8) {
      pfVar48 = gauss_s1_c1;
    }
    uVar53 = 0;
    local_120 = local_120 + 4;
    uVar47 = 0xfffffff8;
    lVar50 = (long)haarResponseX + lVar61;
    lVar41 = (long)haarResponseY + lVar61;
    do {
      pfVar63 = gauss_s1_c1;
      if (uVar47 != 7) {
        pfVar63 = gauss_s1_c0;
      }
      auVar100 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar47 == 0xfffffff8) {
        pfVar63 = gauss_s1_c1;
      }
      uVar64 = (ulong)(uVar47 >> 0x1c & 0xfffffff8);
      uVar40 = uVar53;
      lVar43 = lVar41;
      lVar62 = lVar50;
      do {
        lVar51 = 0;
        pfVar54 = (float *)((long)pfVar48 + (ulong)(uint)((int)(uVar38 >> 0x1f) << 5));
        do {
          fVar8 = pfVar63[uVar64] * *pfVar54;
          pfVar54 = pfVar54 + (ulong)(~uVar37 >> 0x1f) * 2 + -1;
          auVar65 = vinsertps_avx(ZEXT416(*(uint *)(lVar43 + lVar51 * 4)),
                                  ZEXT416(*(uint *)(lVar62 + lVar51 * 4)),0x10);
          lVar51 = lVar51 + 1;
          auVar93._0_4_ = fVar8 * auVar65._0_4_;
          auVar93._4_4_ = fVar8 * auVar65._4_4_;
          auVar93._8_4_ = fVar8 * auVar65._8_4_;
          auVar93._12_4_ = fVar8 * auVar65._12_4_;
          auVar65 = vandps_avx(auVar93,auVar84);
          auVar65 = vmovlhps_avx(auVar93,auVar65);
          auVar86._0_4_ = auVar100._0_4_ + auVar65._0_4_;
          auVar86._4_4_ = auVar100._4_4_ + auVar65._4_4_;
          auVar86._8_4_ = auVar100._8_4_ + auVar65._8_4_;
          auVar86._12_4_ = auVar100._12_4_ + auVar65._12_4_;
          auVar100 = ZEXT1664(auVar86);
        } while (lVar51 != 9);
        uVar40 = uVar40 + 0x18;
        uVar64 = uVar64 + (ulong)(-1 < (int)uVar47) * 2 + -1;
        lVar62 = lVar62 + 0x60;
        lVar43 = lVar43 + 0x60;
      } while (uVar40 < uVar47 * 0x18 + 0x198);
      uVar47 = uVar47 + 5;
      uVar53 = uVar53 + 0x78;
      fVar8 = gauss_s2_arr[lVar59];
      auVar20._4_4_ = fVar8;
      auVar20._0_4_ = fVar8;
      auVar20._8_4_ = fVar8;
      auVar20._12_4_ = fVar8;
      auVar68 = vmulps_avx512vl(auVar86,auVar20);
      lVar59 = lVar59 + 1;
      auVar87._0_4_ = auVar68._0_4_ * auVar68._0_4_;
      auVar87._4_4_ = auVar68._4_4_ * auVar68._4_4_;
      auVar87._8_4_ = auVar68._8_4_ * auVar68._8_4_;
      auVar87._12_4_ = auVar68._12_4_ * auVar68._12_4_;
      auVar66 = vshufpd_avx(auVar68,auVar68,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar60) = auVar68;
      lVar60 = lVar60 + 4;
      lVar50 = lVar50 + 0x1e0;
      lVar41 = lVar41 + 0x1e0;
      auVar65 = vmovshdup_avx(auVar87);
      auVar67 = vfmadd231ss_fma(auVar65,auVar68,auVar68);
      auVar65 = vshufps_avx(auVar68,auVar68,0xff);
      auVar66 = vfmadd213ss_fma(auVar66,auVar66,auVar67);
      auVar65 = vfmadd213ss_fma(auVar65,auVar65,auVar66);
      fVar80 = fVar80 + auVar65._0_4_;
    } while (local_120 != (int)lVar59);
    lVar61 = lVar61 + 0x14;
    uVar38 = (ulong)(uVar37 + 5);
  } while ((int)uVar37 < 3);
  if (fVar80 < 0.0) {
    fVar80 = sqrtf(fVar80);
  }
  else {
    auVar65 = vsqrtss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
    fVar80 = auVar65._0_4_;
  }
  lVar61 = 0;
  auVar100 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar80)));
  do {
    auVar103 = vmulps_avx512f(auVar100,*(undefined1 (*) [64])(ipoint->descriptor + lVar61));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar61) = auVar103;
    lVar61 = lVar61 + 0x10;
  } while (lVar61 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_3_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=3, k_count+=3) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}